

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# owner.cpp
# Opt level: O1

string * fs_get_owner_name_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  passwd *ppVar4;
  char *__file;
  __uid_t _Var5;
  string_view fname;
  statx sx;
  stat sStack_1a8;
  allocator<char> local_118 [20];
  __uid_t local_104;
  
  __file = path._M_str;
  _Var5 = 0xffffff9c;
  iVar2 = statx(0xffffff9c,__file,0x800,8,local_118);
  if (iVar2 == 0) {
    bVar1 = true;
    sStack_1a8.st_uid = local_104;
  }
  else {
    piVar3 = __errno_location();
    if (*piVar3 == 0x26) {
      iVar2 = stat(__file,&sStack_1a8);
      _Var5 = (__uid_t)__file;
      if (iVar2 == 0) {
        bVar1 = true;
        goto LAB_0011366a;
      }
    }
    sStack_1a8.st_uid = _Var5;
    bVar1 = false;
  }
LAB_0011366a:
  if ((bVar1) && (ppVar4 = getpwuid(sStack_1a8.st_uid), ppVar4 != (passwd *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,ppVar4->pw_name,local_118);
    return __return_storage_ptr__;
  }
  fname._M_str = "fs_get_owner_name";
  fname._M_len = 0x11;
  fs_print_error(path,fname);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string
fs_get_owner_name(std::string_view path)
{
#if defined(_WIN32)
  if (std::string s = fs_win32_owner(path, false); !s.empty())
    return s;
#else
  if (auto uid = fs_stat_uid(path)) {
    if (auto pw = getpwuid(uid.value()))
      return pw->pw_name;
  }
#endif

  fs_print_error(path, __func__);
  return {};
}